

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O2

CoeffReturnType __thiscall
Eigen::internal::
product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_-1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
::coeff(product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
        *this,Index index)

{
  Scalar SVar1;
  BlockImpl_dense<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_3,_1,_true,_true> BStack_168;
  LhsNested local_138 [5];
  long local_110;
  long lStack_108;
  undefined8 local_100;
  long lStack_f8;
  Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_1,__1,_false>
  local_e8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_3,_1,_true>_>
  local_a0;
  
  Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_-1,_1>_>,_1,_-1,_false>
  ::Block(&local_e8,&this->m_lhs,index);
  local_138._17_8_ =
       local_e8.
       super_BlockImpl<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_1,__1,_false,_Eigen::Dense>
       .
       super_BlockImpl_dense<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_1,__1,_false,_false>
       .m_xpr.m_rhs._9_8_;
  local_138[0] = local_e8.
                 super_BlockImpl<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_1,__1,_false,_false>
                 .m_xpr.m_lhs;
  local_110 = local_e8.
              super_BlockImpl<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_1,__1,_false,_Eigen::Dense>
              .
              super_BlockImpl_dense<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_1,__1,_false,_false>
              .m_startRow.m_value;
  lStack_108 = local_e8.
               super_BlockImpl<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_1,__1,_false,_Eigen::Dense>
               .
               super_BlockImpl_dense<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_1,__1,_false,_false>
               .m_startCol.m_value;
  local_100 = local_e8.
              super_BlockImpl<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_1,__1,_false,_Eigen::Dense>
              .
              super_BlockImpl_dense<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_1,__1,_false,_false>
              ._56_8_;
  lStack_f8 = local_e8.
              super_BlockImpl<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_1,__1,_false,_Eigen::Dense>
              .
              super_BlockImpl_dense<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_1,__1,_false,_false>
              .m_blockCols.m_value;
  BlockImpl_dense<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_3,_1,_true,_true>::BlockImpl_dense
            (&BStack_168,this->m_rhs,0);
  MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,-1,0,-1,-1>const,Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,-1,1>const>const,1,-1,false>const>>
  ::cwiseProduct<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>const,3,1,true>>
            (&local_a0,local_138,
             (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_3,_1,_true>_> *)
             &BStack_168);
  SVar1 = DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_-1,_1>_>,_1,_-1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_3,_1,_true>_>_>
          ::sum((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_3,_1,_true>_>_>
                 *)&local_a0);
  return SVar1;
}

Assistant:

const CoeffReturnType coeff(Index index) const
  {
    const Index row = (RowsAtCompileTime == 1 || MaxRowsAtCompileTime==1) ? 0 : index;
    const Index col = (RowsAtCompileTime == 1 || MaxRowsAtCompileTime==1) ? index : 0;
    return (m_lhs.row(row).transpose().cwiseProduct( m_rhs.col(col) )).sum();
  }